

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall
ExprWriterTest_IteratedLogicalExprPrecedence_Test::TestBody
          (ExprWriterTest_IteratedLogicalExprPrecedence_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  ExprBase EVar3;
  ExprBase this_00;
  ExprBase other;
  ExprBase then_expr;
  ExprBase this_01;
  long in_RDI;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  LogicalExpr args2 [2];
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  LogicalExpr args [2];
  NumericConstant n1;
  NumericConstant n0;
  ExprWriterTest *in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb20;
  Kind in_stack_fffffffffffffb24;
  undefined4 uVar4;
  BasicExprFactory<std::allocator<char>_> *in_stack_fffffffffffffb28;
  ExprBase in_stack_fffffffffffffb30;
  ExprBase in_stack_fffffffffffffb38;
  int iVar5;
  ExprBase else_expr;
  ExprBase in_stack_fffffffffffffb40;
  ExprBase in_stack_fffffffffffffb48;
  Type TVar6;
  AssertHelper *in_stack_fffffffffffffb50;
  CStringRef in_stack_fffffffffffffb58;
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *in_stack_fffffffffffffb78;
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *args_00;
  undefined8 in_stack_fffffffffffffb80;
  Kind KVar7;
  ExprWriterTest *in_stack_fffffffffffffb88;
  ExprWriterTest *this_02;
  Message *in_stack_fffffffffffffb98;
  undefined7 in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffba7;
  Impl local_3b8 [10];
  Impl *local_390;
  Impl *local_380;
  BasicCStringRef<char> local_370;
  string local_368 [32];
  AssertionResult local_348;
  Impl local_338 [10];
  Impl *local_310;
  pointer local_308;
  Impl *local_2f0;
  Impl *local_2e0;
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> local_2d0;
  Impl *local_2a8;
  BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39> local_298;
  BasicCStringRef<char> local_288;
  string local_280 [32];
  AssertionResult local_260;
  undefined8 local_250;
  ExprWriterTest local_248;
  Impl *local_1e8;
  Impl *local_1d8;
  BasicExpr<(mp::expr::Kind)66,_(mp::expr::Kind)67> local_1a0;
  BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39> local_190;
  BasicCStringRef<char> local_180;
  string local_178 [32];
  AssertionResult local_158;
  undefined8 local_148;
  undefined8 local_138;
  BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52> local_128;
  undefined8 local_120;
  Impl *local_108;
  Impl *local_f8;
  BasicExpr<(mp::expr::Kind)66,_(mp::expr::Kind)67> local_b0;
  BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39> local_a0;
  BasicCStringRef<char> local_90;
  string local_88 [32];
  AssertionResult local_68;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_40;
  BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52> local_30;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48> local_28;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_18;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_10;
  
  KVar7 = (Kind)((ulong)in_stack_fffffffffffffb80 >> 0x20);
  local_10.super_ExprBase.impl_ =
       (ExprBase)ExprWriterTest::MakeConst(in_stack_fffffffffffffb18,6.1203617042699e-318);
  local_18.super_ExprBase.impl_ =
       (ExprBase)ExprWriterTest::MakeConst(in_stack_fffffffffffffb18,6.1205049833072e-318);
  local_40 = *(undefined8 *)(in_RDI + 0x48);
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb28,
             (LogicalConstant)in_stack_fffffffffffffb30.impl_,in_stack_fffffffffffffb24);
  local_50 = *(undefined8 *)(in_RDI + 0x48);
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb28,
             (LogicalConstant)in_stack_fffffffffffffb30.impl_,in_stack_fffffffffffffb24);
  local_30.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeBinaryLogical
                 (in_stack_fffffffffffffb28,in_stack_fffffffffffffb24,
                  (LogicalExpr)in_stack_fffffffffffffb38.impl_,
                  (LogicalExpr)in_stack_fffffffffffffb30.impl_);
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb28,
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
              )in_stack_fffffffffffffb30.impl_,in_stack_fffffffffffffb24);
  local_58 = *(undefined8 *)(in_RDI + 0x48);
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb28,
             (LogicalConstant)in_stack_fffffffffffffb30.impl_,in_stack_fffffffffffffb24);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_90,"{}");
  mp::ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>::ArrayRef<2ul>
            ((ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)
             CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> (*) [2])in_stack_fffffffffffffb18);
  local_b0.super_ExprBase.impl_ =
       (ExprBase)
       ExprWriterTest::MakeIteratedLogical
                 (in_stack_fffffffffffffb88,KVar7,in_stack_fffffffffffffb78);
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb28,
             (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>
              )in_stack_fffffffffffffb30.impl_,in_stack_fffffffffffffb24);
  local_f8 = (Impl *)local_18.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb28,
             (NumericConstant)in_stack_fffffffffffffb30.impl_,in_stack_fffffffffffffb24);
  local_108 = (Impl *)local_10.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb28,
             (NumericConstant)in_stack_fffffffffffffb30.impl_,in_stack_fffffffffffffb24);
  local_a0.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeIf
                 ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffb30.impl_,
                  (LogicalExpr)in_stack_fffffffffffffb48.impl_,
                  (NumericExpr)in_stack_fffffffffffffb40.impl_,
                  (NumericExpr)in_stack_fffffffffffffb38.impl_);
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb28,
             (BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>)
             in_stack_fffffffffffffb30.impl_,in_stack_fffffffffffffb24);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_fffffffffffffb58,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb50);
  testing::internal::EqHelper<false>::Compare<char[39],std::__cxx11::string>
            ((char *)in_stack_fffffffffffffb38.impl_,(char *)in_stack_fffffffffffffb30.impl_,
             (char (*) [39])in_stack_fffffffffffffb28,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
  std::__cxx11::string::~string(local_88);
  mp::ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::~ArrayRef
            ((ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)0x12e99b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_68);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb50);
    testing::AssertionResult::failure_message((AssertionResult *)0x12ea41);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb50,(Type)((ulong)in_stack_fffffffffffffb48.impl_ >> 0x20),
               (char *)in_stack_fffffffffffffb40.impl_,
               (int)((ulong)in_stack_fffffffffffffb38.impl_ >> 0x20),
               (char *)in_stack_fffffffffffffb30.impl_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
    testing::Message::~Message((Message *)0x12eaa4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12eafc);
  local_138 = *(undefined8 *)(in_RDI + 0x48);
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb28,
             (LogicalConstant)in_stack_fffffffffffffb30.impl_,in_stack_fffffffffffffb24);
  local_148 = *(undefined8 *)(in_RDI + 0x48);
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb28,
             (LogicalConstant)in_stack_fffffffffffffb30.impl_,in_stack_fffffffffffffb24);
  local_128.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeBinaryLogical
                 (in_stack_fffffffffffffb28,in_stack_fffffffffffffb24,
                  (LogicalExpr)in_stack_fffffffffffffb38.impl_,
                  (LogicalExpr)in_stack_fffffffffffffb30.impl_);
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb28,
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
              )in_stack_fffffffffffffb30.impl_,in_stack_fffffffffffffb24);
  local_28.super_ExprBase.impl_ = (ExprBase)(ExprBase)local_120;
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_180,"{}");
  mp::ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>::ArrayRef<2ul>
            ((ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)
             CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> (*) [2])in_stack_fffffffffffffb18);
  local_1a0.super_ExprBase.impl_ =
       (ExprBase)
       ExprWriterTest::MakeIteratedLogical
                 (in_stack_fffffffffffffb88,KVar7,in_stack_fffffffffffffb78);
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb28,
             (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>
              )in_stack_fffffffffffffb30.impl_,in_stack_fffffffffffffb24);
  local_1d8 = (Impl *)local_18.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb28,
             (NumericConstant)in_stack_fffffffffffffb30.impl_,in_stack_fffffffffffffb24);
  local_1e8 = (Impl *)local_10.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb28,
             (NumericConstant)in_stack_fffffffffffffb30.impl_,in_stack_fffffffffffffb24);
  local_190.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeIf
                 ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffb30.impl_,
                  (LogicalExpr)in_stack_fffffffffffffb48.impl_,
                  (NumericExpr)in_stack_fffffffffffffb40.impl_,
                  (NumericExpr)in_stack_fffffffffffffb38.impl_);
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb28,
             (BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>)
             in_stack_fffffffffffffb30.impl_,in_stack_fffffffffffffb24);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_fffffffffffffb58,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb50);
  testing::internal::EqHelper<false>::Compare<char[39],std::__cxx11::string>
            ((char *)in_stack_fffffffffffffb38.impl_,(char *)in_stack_fffffffffffffb30.impl_,
             (char (*) [39])in_stack_fffffffffffffb28,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
  std::__cxx11::string::~string(local_178);
  mp::ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::~ArrayRef
            ((ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)0x12ed50);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_158);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb50);
    in_stack_fffffffffffffb98 =
         (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x12ee08);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb50,(Type)((ulong)in_stack_fffffffffffffb48.impl_ >> 0x20),
               (char *)in_stack_fffffffffffffb40.impl_,
               (int)((ulong)in_stack_fffffffffffffb38.impl_ >> 0x20),
               (char *)in_stack_fffffffffffffb30.impl_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffba0),in_stack_fffffffffffffb98);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
    testing::Message::~Message((Message *)0x12ee6b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12eec3);
  local_248.super_ExprFactory.funcs_.
  super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(in_RDI + 0x48);
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb28,
             (LogicalConstant)in_stack_fffffffffffffb30.impl_,in_stack_fffffffffffffb24);
  local_28.super_ExprBase.impl_ =
       (ExprBase)
       (ExprBase)
       local_248.l0.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_;
  this_02 = &local_248;
  mp::ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>::ArrayRef<2ul>
            ((ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)
             CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> (*) [2])in_stack_fffffffffffffb18);
  local_248.super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)ExprWriterTest::MakeIteratedLogical(this_02,KVar7,in_stack_fffffffffffffb78);
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb28,
             (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>
              )in_stack_fffffffffffffb30.impl_,in_stack_fffffffffffffb24);
  local_250 = *(undefined8 *)(in_RDI + 0x48);
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb28,
             (LogicalConstant)in_stack_fffffffffffffb30.impl_,in_stack_fffffffffffffb24);
  mp::ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::~ArrayRef
            ((ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)0x12ef96);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_288,"{}");
  args_00 = &local_2d0;
  mp::ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>::ArrayRef<2ul>
            ((ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)
             CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> (*) [2])in_stack_fffffffffffffb18);
  EVar3.impl_ = (Impl *)ExprWriterTest::MakeIteratedLogical(this_02,KVar7,args_00);
  local_2a8 = EVar3.impl_;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb28,
             (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>
              )in_stack_fffffffffffffb30.impl_,in_stack_fffffffffffffb24);
  KVar7 = SUB84(EVar3.impl_,4);
  local_2e0 = (Impl *)local_18.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb28,
             (NumericConstant)in_stack_fffffffffffffb30.impl_,in_stack_fffffffffffffb24);
  local_2f0 = (Impl *)local_10.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb28,
             (NumericConstant)in_stack_fffffffffffffb30.impl_,in_stack_fffffffffffffb24);
  local_298.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeIf
                 ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffb30.impl_,
                  (LogicalExpr)in_stack_fffffffffffffb48.impl_,
                  (NumericExpr)in_stack_fffffffffffffb40.impl_,
                  (NumericExpr)in_stack_fffffffffffffb38.impl_);
  TVar6 = (Type)((ulong)in_stack_fffffffffffffb48.impl_ >> 0x20);
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb28,
             (BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>)
             in_stack_fffffffffffffb30.impl_,in_stack_fffffffffffffb24);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_fffffffffffffb58,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb50);
  testing::internal::EqHelper<false>::Compare<char[52],std::__cxx11::string>
            ((char *)in_stack_fffffffffffffb38.impl_,(char *)in_stack_fffffffffffffb30.impl_,
             (char (*) [52])in_stack_fffffffffffffb28,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
  iVar5 = (int)((ulong)in_stack_fffffffffffffb38.impl_ >> 0x20);
  std::__cxx11::string::~string(local_280);
  mp::ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::~ArrayRef
            ((ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)0x12f11f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_260);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb50);
    in_stack_fffffffffffffb58.data_ =
         testing::AssertionResult::failure_message((AssertionResult *)0x12f1fa);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb50,TVar6,(char *)in_stack_fffffffffffffb40.impl_,iVar5,
               (char *)in_stack_fffffffffffffb30.impl_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffba0),in_stack_fffffffffffffb98);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
    testing::Message::~Message((Message *)0x12f257);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12f2af);
  EVar3.impl_ = local_338;
  mp::ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>::ArrayRef<2ul>
            ((ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)
             CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> (*) [2])in_stack_fffffffffffffb18);
  this_00.impl_ = (Impl *)ExprWriterTest::MakeIteratedLogical(this_02,KVar7,args_00);
  local_310 = this_00.impl_;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb28,
             (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>
              )in_stack_fffffffffffffb30.impl_,in_stack_fffffffffffffb24);
  local_248.super_ExprFactory.funcs_.
  super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>.
  _M_impl.super__Vector_impl_data._M_start = local_308;
  mp::ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::~ArrayRef
            ((ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)0x12f32a);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_370,"{}");
  other.impl_ = (Impl *)(in_RDI + 0x10);
  else_expr.impl_ = local_3b8;
  mp::ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>::ArrayRef<2ul>
            ((ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)
             CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> (*) [2])in_stack_fffffffffffffb18);
  then_expr.impl_ = (Impl *)ExprWriterTest::MakeIteratedLogical(this_02,KVar7,args_00);
  local_390 = then_expr.impl_;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb28,
             (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>
              )other.impl_,in_stack_fffffffffffffb24);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb28,
             (NumericConstant)other.impl_,in_stack_fffffffffffffb24);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb28,
             (NumericConstant)other.impl_,in_stack_fffffffffffffb24);
  this_01.impl_ =
       (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeIf
                         ((BasicExprFactory<std::allocator<char>_> *)other.impl_,
                          (LogicalExpr)EVar3.impl_,(NumericExpr)then_expr.impl_,
                          (NumericExpr)else_expr.impl_);
  TVar6 = (Type)((ulong)EVar3.impl_ >> 0x20);
  local_380 = this_01.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)this_01.impl_,
             (BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>)
             other.impl_,in_stack_fffffffffffffb24);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_fffffffffffffb58,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)this_00.impl_);
  testing::internal::EqHelper<false>::Compare<char[52],std::__cxx11::string>
            ((char *)else_expr.impl_,(char *)other.impl_,(char (*) [52])this_01.impl_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
  iVar5 = (int)((ulong)else_expr.impl_ >> 0x20);
  std::__cxx11::string::~string(local_368);
  mp::ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::~ArrayRef
            ((ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)0x12f4b3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_348);
  uVar4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb24);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00.impl_);
    testing::AssertionResult::failure_message((AssertionResult *)0x12f58e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00.impl_,TVar6,(char *)then_expr.impl_,iVar5,(char *)other.impl_
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffba0),in_stack_fffffffffffffb98);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(uVar4,in_stack_fffffffffffffb20));
    testing::Message::~Message((Message *)0x12f5e9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12f63e);
  return;
}

Assistant:

TEST_F(ExprWriterTest, IteratedLogicalExprPrecedence) {
  auto n0 = MakeConst(0), n1 = MakeConst(1);
  LogicalExpr args[] = {MakeBinaryLogical(ex::AND, l0, l0), l0};
  CHECK_WRITE("if /* forall */ ((0 && 0) && 0) then 1",
      MakeIf(MakeIteratedLogical(ex::FORALL, args), n1, n0));
  args[0] = MakeBinaryLogical(ex::OR, l0, l0);
  CHECK_WRITE("if /* exists */ ((0 || 0) || 0) then 1",
      MakeIf(MakeIteratedLogical(ex::EXISTS, args), n1, n0));
  args[0] = l0;
  LogicalExpr args2[] = {MakeIteratedLogical(ex::FORALL, args), l0};
  CHECK_WRITE("if /* forall */ (/* forall */ (0 && 0) && 0) then 1",
      MakeIf(MakeIteratedLogical(ex::FORALL, args2), n1, n0));
  args2[0] = MakeIteratedLogical(ex::EXISTS, args);
  CHECK_WRITE("if /* exists */ (/* exists */ (0 || 0) || 0) then 1",
      MakeIf(MakeIteratedLogical(ex::EXISTS, args2), n1, n0));
}